

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sockets.cpp
# Opt level: O0

void __thiscall Socket::Socket(Socket *this,addrinfo *host,int type)

{
  sockaddr *__src;
  int iVar1;
  unsigned_long *puVar2;
  system_error *this_00;
  int *piVar3;
  error_category *__ecat;
  sockaddr *local_3b0;
  string local_398 [32];
  stringstream local_378 [8];
  stringstream stream_1;
  ostream local_368 [376];
  ulong local_1f0;
  unsigned_long local_1e8;
  string local_1e0 [48];
  stringstream local_1b0 [8];
  stringstream stream;
  ostream local_1a0 [376];
  addrinfo *local_28;
  addrinfo *rp;
  addrinfo *paStack_18;
  int type_local;
  addrinfo *host_local;
  Socket *this_local;
  
  rp._4_4_ = type;
  paStack_18 = host;
  host_local = (addrinfo *)this;
  iVar1 = InitSocketLibrary();
  this->m_WSAInitialized = (uint)((iVar1 != 0 ^ 0xffU) & 1);
  if (rp._4_4_ == 2) {
    local_3b0 = (sockaddr *)&this->m_SockAddress;
  }
  else {
    local_3b0 = (sockaddr *)0x0;
  }
  this->m_DestAddr = local_3b0;
  this->m_DestAddrLen = 0;
  local_28 = paStack_18;
  do {
    if (local_28 == (addrinfo *)0x0) {
      std::__cxx11::stringstream::stringstream(local_378);
      std::operator<<(local_368,"Unable to create socket");
      std::__cxx11::stringstream::str();
      Logger::Log(3,local_398);
      std::__cxx11::string::~string((string *)local_398);
      std::__cxx11::stringstream::~stringstream(local_378);
      this_00 = (system_error *)__cxa_allocate_exception(0x20);
      piVar3 = __errno_location();
      iVar1 = *piVar3;
      __ecat = (error_category *)std::_V2::system_category();
      std::system_error::system_error(this_00,iVar1,__ecat);
      __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
    }
    iVar1 = socket(local_28->ai_family,rp._4_4_,0);
    this->m_Socket = iVar1;
    if (this->m_Socket != -1) {
      if (rp._4_4_ != 1) {
        this->m_DestAddrLen = local_28->ai_addrlen;
LAB_0018a828:
        __src = local_28->ai_addr;
        local_1e8 = 0x80;
        local_1f0 = (ulong)local_28->ai_addrlen;
        puVar2 = std::min<unsigned_long>(&local_1e8,&local_1f0);
        memcpy(&this->m_SockAddress,__src,*puVar2);
        return;
      }
      iVar1 = connect(this->m_Socket,(sockaddr *)local_28->ai_addr,local_28->ai_addrlen);
      if (iVar1 == 0) goto LAB_0018a828;
      std::__cxx11::stringstream::stringstream(local_1b0);
      std::operator<<(local_1a0,"Socket(): connect failed");
      std::__cxx11::stringstream::str();
      Logger::Log(2,local_1e0);
      std::__cxx11::string::~string((string *)local_1e0);
      std::__cxx11::stringstream::~stringstream(local_1b0);
      close(this->m_Socket);
      this->m_Socket = -1;
    }
    local_28 = local_28->ai_next;
  } while( true );
}

Assistant:

Socket::Socket(const struct addrinfo* const host, const int type)
    : m_WSAInitialized(!InitSocketLibrary()),
    m_DestAddr(SOCK_DGRAM == type ? reinterpret_cast<const struct sockaddr*>(&m_SockAddress) : nullptr),
    m_DestAddrLen(0)
{
    for (auto rp = host; rp; rp = rp->ai_next) {
        m_Socket = socket(rp->ai_family, type, 0);
        if (INVALID_SOCKET == m_Socket) {
            continue;
        }
        if (SOCK_STREAM == type) {
            if (::connect(m_Socket, rp->ai_addr, rp->ai_addrlen)) {
                LOG_WARN("Socket(): connect failed");
                closesocket(m_Socket);
                m_Socket = INVALID_SOCKET;
                continue;
            }
        } else { /*if (SOCK_DGRAM == type)*/
#if defined(_WIN32) || defined(__CYGWIN__)
            // MSVC on Windows is the only platform using different types for connect() and ai_addrlen ...
            m_DestAddrLen = static_cast<decltype(m_DestAddrLen)>(rp->ai_addrlen);
#else
            m_DestAddrLen = rp->ai_addrlen;
#endif
        }
        memcpy(&m_SockAddress, rp->ai_addr, std::min<size_t>(sizeof(m_SockAddress), rp->ai_addrlen));
        return;
    }
    LOG_ERROR("Unable to create socket");
    throw std::system_error(WSAGetLastError(), std::system_category());
}